

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_filter.c
# Opt level: O2

void * sighip_new(t_floatarg f)

{
  t_sighip *x;
  t_symbol *s1;
  t_symbol *s2;
  
  x = (t_sighip *)pd_new(sighip_class);
  s1 = gensym("float");
  s2 = gensym("ft1");
  inlet_new((t_object *)x,(t_pd *)x,s1,s2);
  outlet_new((t_object *)x,&s_signal);
  x->x_sr = 44100.0;
  (x->x_cspace).c_x = 0.0;
  sighip_ft1(x,f);
  x->x_f = 0.0;
  return x;
}

Assistant:

static void *sighip_new(t_floatarg f)
{
    t_sighip *x = (t_sighip *)pd_new(sighip_class);
    inlet_new(&x->x_obj, &x->x_obj.ob_pd, gensym("float"), gensym("ft1"));
    outlet_new(&x->x_obj, &s_signal);
    x->x_sr = 44100;
    x->x_cspace.c_x = 0;
    sighip_ft1(x, f);
    x->x_f = 0;
    return (x);
}